

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O2

void __thiscall
Js::RecyclableCollectionObjectWalker<Js::JavascriptWeakSet>::GetChildren
          (RecyclableCollectionObjectWalker<Js::JavascriptWeakSet> *this)

{
  int iVar1;
  Type pRVar2;
  int i;
  JavascriptWeakSet *pJVar3;
  int last;
  ulong uVar4;
  RecyclableCollectionObjectWalkerPropertyData<Js::JavascriptWeakSet> local_48;
  SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
  *local_40;
  RecyclableCollectionObjectWalker<Js::JavascriptWeakSet> *local_38;
  
  local_38 = this;
  pJVar3 = VarTo<Js::JavascriptWeakSet>(this->instance);
  local_40 = &(pJVar3->keySet).
              super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
  ;
  for (uVar4 = 0;
      uVar4 < (pJVar3->keySet).
              super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
              .bucketCount; uVar4 = uVar4 + 1) {
    iVar1 = (pJVar3->keySet).
            super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
            .buckets.ptr[uVar4];
    if (iVar1 != -1) {
      last = -1;
      while (i = iVar1, i != -1) {
        pRVar2 = (pJVar3->keySet).
                 super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                 .weakRefs.ptr[i].ptr;
        if (pRVar2 == (Type)0x0) {
          iVar1 = (pJVar3->keySet).
                  super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                  .entries.ptr[i].super_ValueEntryData<bool>.next;
          JsUtil::
          SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
          ::RemoveAt(local_40,i,last,(uint)uVar4);
        }
        else {
          local_48.value = pRVar2;
          JsUtil::
          List<Js::RecyclableCollectionObjectWalkerPropertyData<Js::JavascriptWeakSet>,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          ::Add(local_38->propertyList,&local_48);
          iVar1 = (pJVar3->keySet).
                  super_SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
                  .entries.ptr[i].super_ValueEntryData<bool>.next;
          last = i;
        }
      }
    }
  }
  return;
}

Assistant:

void RecyclableCollectionObjectWalker<JavascriptWeakSet>::GetChildren()
    {
        JavascriptWeakSet* data = VarTo<JavascriptWeakSet>(instance);
        data->Map([&](Var value)
        {
            propertyList->Add(RecyclableCollectionObjectWalkerPropertyData<JavascriptWeakSet>(value));
        });
    }